

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  VMEMcache *pVVar6;
  char *pcVar7;
  uint *puVar8;
  ulong *__ptr;
  void *__ptr_00;
  undefined8 uVar9;
  uint seed;
  undefined8 uVar10;
  int i;
  long lVar11;
  FILE *pFVar12;
  char *pcVar13;
  vmemcache_repl_p repl_p;
  size_t __n;
  char *pcStackY_1690;
  stat_t entries;
  stat_t in_stack_ffffffffffffe980;
  char *in_stack_ffffffffffffe988;
  char value [257];
  undefined1 local_1478 [256];
  char local_1378 [256];
  char local_1278 [256];
  char local_1178 [1280];
  undefined1 local_c78 [256];
  char local_b78 [2304];
  char local_278 [8];
  char key [256];
  char vbuf [257];
  char *local_68;
  char *local_60;
  long local_40;
  size_t vsize;
  
  if (argc < 2) {
    fprintf(_stderr,"usage: %s dir-name\n",*argv);
    exit(-1);
  }
  pcVar13 = argv[1];
  if (argc != 3) {
    vsize = time((time_t *)0x0);
    printf("seed: %u\n",vsize & 0xffffffff);
LAB_0010242c:
    test_new_delete(pcVar13,*argv,VMEMCACHE_REPLACEMENT_NONE);
    test_new_delete(pcVar13,*argv,VMEMCACHE_REPLACEMENT_LRU);
    test_put_get_evict(pcVar13,VMEMCACHE_REPLACEMENT_NONE);
    test_put_get_evict(pcVar13,VMEMCACHE_REPLACEMENT_LRU);
    pVVar6 = (VMEMcache *)vmemcache_new();
    vmemcache_set_size(pVVar6,0x100000);
    vmemcache_set_extent_size(pVVar6,0x100);
    iVar2 = vmemcache_add(pVVar6);
    if (iVar2 == 0) {
      memset(local_278,0,0x100);
      for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
        value[lVar11 + -8] = (char)lVar11;
      }
      iVar2 = vmemcache_put(pVVar6,local_278,0x100,&stack0xffffffffffffe988,0x100);
      if (iVar2 == 0) {
        verify_stat_entries(pVVar6,1);
        local_40 = 0;
        pcVar7 = (char *)vmemcache_get(pVVar6,local_278,0x100,key + 0xf8,0x100,0x21,&local_40);
        if (-1 < (long)pcVar7) {
          if (pcVar7 == (char *)0xdf) {
            if (local_40 != 0x100) {
              fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                      "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                      ,0x48a,"test_get_with_offset");
              lVar11 = local_40;
LAB_00103249:
              pcVar13 = "vmemcache_get: wrong size of value: %zi (should be %i)";
LAB_00103250:
              fprintf(_stderr,pcVar13,lVar11,0x100);
              goto LAB_00102d51;
            }
            pcStackY_1690 = value + 0x19;
            value[0xf8] = '\0';
            iVar2 = bcmp(key + 0xf8,pcStackY_1690,0xdf);
            if (iVar2 == 0) {
              vmemcache_delete(pVVar6);
              local_40 = 0;
              pcVar7 = key + 0xf8;
              memset(pcVar7,0,0x120);
              pVVar6 = (VMEMcache *)vmemcache_new();
              vmemcache_set_size(pVVar6,0x100000);
              vmemcache_set_extent_size(pVVar6,0x100);
              vmemcache_set_eviction_policy(pVVar6,1);
              iVar2 = vmemcache_add(pVVar6,pcVar13);
              if (iVar2 != 0) {
                pcVar13 = "test_evict";
                uVar10 = 0x1da;
                goto LAB_001035c2;
              }
              vmemcache_callback_on_evict(pVVar6,on_evict_test_evict_cb,pcVar7);
              vmemcache_callback_on_miss(pVVar6,on_miss_test_evict_cb,pcVar7);
              lVar11 = -10;
              pcVar7 = value + 0xf8;
              do {
                if (lVar11 == 0) {
                  verify_stat_entries(pVVar6,10);
                  iVar2 = vmemcache_evict(pVVar6,local_c78,0x100);
                  if (iVar2 == -1) {
                    uVar10 = 499;
                  }
                  else {
                    if (stack0xffffffffffffff90 != 0x100) {
                      uVar10 = 0x1f8;
LAB_0010323b:
                      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                              ,uVar10,"test_evict");
                      lVar11 = stack0xffffffffffffff90;
                      goto LAB_00103249;
                    }
                    pcStackY_1690 = local_b78;
                    iVar2 = strncmp(key + 0xf8,pcStackY_1690,0x100);
                    if (iVar2 != 0) {
                      pcVar13 = "test_evict";
                      uVar10 = 0x1fd;
                      goto LAB_00103285;
                    }
                    iVar2 = vmemcache_evict(pVVar6,0,0);
                    if (iVar2 == -1) {
                      uVar10 = 0x203;
                    }
                    else {
                      pcStackY_1690 = value + 0xf8;
                      iVar2 = strncmp(key + 0xf8,pcStackY_1690,0x100);
                      if (iVar2 != 0) {
                        pcVar13 = "test_evict";
                        uVar10 = 0x20d;
                        goto LAB_00103285;
                      }
                      lVar11 = vmemcache_get(pVVar6,local_1478,0x100,local_278,0x100,0,&local_40);
                      if (lVar11 < 0) {
                        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                ,0x214,"test_evict");
                        pcVar13 = "vmemcache_get";
                        goto LAB_00102db6;
                      }
                      if (lVar11 != 0x100) {
                        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                ,0x219,"test_evict");
                        pcVar13 = "vmemcache_get: wrong return value: %zi (should be %i)";
                        goto LAB_00103250;
                      }
                      if (local_40 != 0x100) {
                        uVar10 = 0x21e;
                        goto LAB_0010323b;
                      }
                      pcStackY_1690 = local_1378;
                      iVar2 = strncmp(local_278,pcStackY_1690,0x100);
                      if (iVar2 != 0) {
                        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                ,0x223,"test_evict");
                        local_60 = local_278;
                        goto LAB_0010329d;
                      }
                      iVar2 = vmemcache_evict(pVVar6,0,0);
                      if (iVar2 != -1) {
                        pcStackY_1690 = local_1178;
                        iVar2 = strncmp(key + 0xf8,pcStackY_1690,0x100);
                        if (iVar2 != 0) {
                          pcVar13 = "test_evict";
                          uVar10 = 0x233;
                          goto LAB_00103285;
                        }
                        pcStackY_1690 = local_1278;
                        lVar11 = vmemcache_get(pVVar6,pcStackY_1690,0x100,local_278,0x100,0,
                                               &local_40);
                        if (lVar11 != -1) {
                          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                  ,0x23b,"test_evict");
                          pcVar13 = "vmemcache_get succeeded when it shouldn\'t";
                          pcStackY_1690 = (char *)0x29;
                          goto LAB_00102db8;
                        }
                        puVar8 = (uint *)__errno_location();
                        if (*puVar8 != 2) {
                          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                  ,0x23e,"test_evict");
                          fprintf(_stderr,"vmemcache_get: errno %d should be ENOENT",(ulong)*puVar8)
                          ;
                          goto LAB_00102d51;
                        }
                        iVar2 = strncmp(key + 0xf8,pcStackY_1690,0x100);
                        if (iVar2 != 0) {
                          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                  ,0x243,"test_evict");
                          pcVar13 = "vmemcache_get: wrong value: %s (should be %s)";
                          local_60 = key + 0xf8;
                          goto LAB_001034ee;
                        }
                        entries = 0;
                        vmemcache_get(pVVar6,pcStackY_1690,0x100,0,0x100,0);
                        iVar2 = vmemcache_put(pVVar6,pcStackY_1690,0x100,local_278,0x100001);
                        if (iVar2 == 0) {
                          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                  ,0x24c,"test_evict");
                          pcVar13 = "vmemcache_put: too large put didn\'t fail";
                          pcStackY_1690 = (char *)0x28;
                          goto LAB_00102db8;
                        }
                        if (*puVar8 != 0x1c) {
                          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                  ,0x252,"test_evict");
                          pFVar12 = _stderr;
                          pcVar13 = strerror(*puVar8);
                          uVar10 = vmemcache_errormsg();
                          pcVar7 = 
                          "vmemcache_put: too large put returned \"%s\" \"%s\" instead of ENOSPC";
                          goto LAB_00102e04;
                        }
                        iVar2 = vmemcache_evict(pVVar6,"non_existent",0xc);
                        if (iVar2 == 0) {
                          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                  ,0x25b,"test_evict");
                          pcVar13 = "vmemcache_evict: return value for nonexistent key equals 0";
                          pcStackY_1690 = (char *)0x3a;
                          goto LAB_00102db8;
                        }
                        if (*puVar8 == 2) goto LAB_00102925;
                        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                                ,0x25f,"test_evict");
                        fprintf(_stderr,"vmemcache_evict: nonexistent key: errno %d (should be %d)",
                                (ulong)*puVar8,2);
                        goto LAB_00102d51;
                      }
                      uVar10 = 0x229;
                    }
                  }
                  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                          ,uVar10,"test_evict");
                  pFVar12 = _stderr;
                  uVar10 = vmemcache_errormsg();
                  pcVar13 = "vmemcache_evict: %s";
                  goto LAB_001026d9;
                }
                pcVar7[-0x100] = 'k';
                iVar2 = (int)lVar11 + 0x3a;
                memset(pcVar7 + -0xff,iVar2,0xfe);
                pcVar7[-1] = '\0';
                pcVar7[0] = 'v';
                memset(pcVar7 + 1,iVar2,0xfe);
                pcVar7[0xff] = '\0';
                iVar2 = vmemcache_put(pVVar6,pcVar7 + -0x100,0x100,pcVar7,0x100);
                lVar11 = lVar11 + 1;
                pcVar7 = pcVar7 + 0x200;
              } while (iVar2 == 0);
              pcVar13 = "test_evict";
              uVar10 = 0x1ea;
              goto LAB_001026c3;
            }
            pcVar13 = "test_get_with_offset";
            uVar10 = 0x492;
LAB_00103285:
            fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                    "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                    ,uVar10,pcVar13);
            local_60 = key + 0xf8;
LAB_0010329d:
            pcVar13 = "vmemcache_get: wrong value: %s (should be %s)";
          }
          else {
            fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                    "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                    ,0x485,"test_get_with_offset");
            pcVar13 = "vmemcache_get: wrong return value: %zi (should be %zu)";
            pcStackY_1690 = (char *)0xdf;
            local_60 = pcVar7;
          }
          goto LAB_001034ee;
        }
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x480,"test_get_with_offset");
        pFVar12 = _stderr;
        uVar10 = vmemcache_errormsg();
        pcVar13 = "vmemcache_get: %s";
      }
      else {
        pcVar13 = "test_get_with_offset";
        uVar10 = 0x46f;
LAB_001026c3:
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,uVar10,pcVar13);
        pFVar12 = _stderr;
        uVar10 = vmemcache_errormsg();
        pcVar13 = "vmemcache_put: %s";
      }
    }
    else {
      pcVar13 = "test_get_with_offset";
      uVar10 = 0x465;
LAB_001035c2:
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,uVar10,pcVar13);
      pFVar12 = _stderr;
      uVar10 = vmemcache_errormsg();
      pcVar13 = "vmemcache_new: %s";
    }
LAB_001026d9:
    fprintf(pFVar12,pcVar13,uVar10);
    goto LAB_00102d51;
  }
  pcVar7 = argv[2];
  in_stack_ffffffffffffe988 = (char *)0x0;
  piVar4 = __errno_location();
  *piVar4 = 0;
  uVar5 = strtoul(pcVar7,(char **)&stack0xffffffffffffe988,10);
  if ((((*piVar4 == 0x22 && uVar5 == 0xffffffffffffffff) || (*piVar4 != 0 && uVar5 == 0)) ||
      (in_stack_ffffffffffffe988 == pcVar7)) || (*in_stack_ffffffffffffe988 != '\0')) {
    fprintf(_stderr,"ERROR: strtoul() failed to convert the string %s",pcVar7);
LAB_00102cfc:
    fputc(10,_stderr);
  }
  else {
    if (uVar5 >> 0x20 != 0) {
      fprintf(_stderr,"ERROR: value %s is bigger than UINT_MAX (%u)",pcVar7,0xffffffffffffffff);
      goto LAB_00102cfc;
    }
    vsize = uVar5;
    if (uVar5 != 0) goto LAB_0010242c;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
          ,0x50a,"main");
  fprintf(_stderr,"incorrect value of seed: %s",argv[2]);
LAB_00102d51:
  fputc(10,_stderr);
  abort();
LAB_00102925:
  do {
    iVar2 = vmemcache_evict(pVVar6,0,0);
  } while (iVar2 == 0);
  pcVar7 = local_60 + 1;
  verify_stats(pVVar6,10,(stat_t)(local_60 + 3),(stat_t)pcVar7,(stat_t)local_68,(stat_t)local_60,
               entries,in_stack_ffffffffffffe980,(stat_t)in_stack_ffffffffffffe988);
  seed = (uint)pcVar7;
  if (local_68 == (char *)0x2) {
    if (local_60 == (char *)0xa) {
      vmemcache_delete(pVVar6);
      repl_p = (vmemcache_repl_p)vsize;
      test_memory_leaks(pcVar13,0,repl_p,seed);
      test_memory_leaks(pcVar13,1,repl_p,seed);
      test_merge_allocations(pcVar13,VMEMCACHE_REPLACEMENT_NONE);
      test_merge_allocations(pcVar13,VMEMCACHE_REPLACEMENT_LRU);
      srand(repl_p);
      uVar10 = vmemcache_new();
      vmemcache_set_size(uVar10,0x100000);
      vmemcache_set_extent_size(uVar10,0x100);
      vmemcache_set_eviction_policy(uVar10,1);
      iVar2 = vmemcache_add(uVar10,pcVar13);
      if (iVar2 != 0) {
        pcVar13 = "test_put_in_evict";
        uVar10 = 0x35a;
        goto LAB_001035c2;
      }
      value[8] = '\0';
      value[9] = '\0';
      value[10] = '\0';
      value[0xb] = '\0';
      value[0xc] = '\0';
      value[0xd] = '\0';
      value[0xe] = '\0';
      value[0xf] = '\0';
      value[0x10] = '\0';
      value[0x11] = '\0';
      value[0x12] = '\0';
      value[0x13] = '\0';
      value[0x14] = '\0';
      value[0x15] = '\0';
      value[0x16] = '\0';
      value[0x17] = '\0';
      value[0] = '\0';
      value[1] = '\0';
      value[2] = '\0';
      value[3] = '\0';
      value[4] = '\0';
      value[5] = '\0';
      value[6] = '\0';
      value[7] = '\0';
      value[0x18] = -0x18;
      value[0x19] = '\x03';
      value[0x1a] = '\0';
      value[0x1b] = '\0';
      value[0x1c] = '\0';
      value[0x1d] = '\0';
      value[0x1e] = '\0';
      value[0x1f] = '\0';
      value[0x20] = -0xc;
      value[0x21] = '\x01';
      value[0x22] = '\0';
      value[0x23] = '\0';
      value[0x24] = '\0';
      value[0x25] = '\0';
      value[0x26] = '\0';
      value[0x27] = '\0';
      value[0x28] = -0x18;
      value[0x29] = '\x03';
      value[0x2a] = '\0';
      value[0x2b] = '\0';
      value[0x2c] = '\0';
      value[0x2d] = '\0';
      value[0x2e] = '\0';
      value[0x2f] = '\0';
      vmemcache_callback_on_evict(uVar10,on_evict_test_put_in_evict_cb,&stack0xffffffffffffe988);
      while ((ulong)value._8_8_ < (ulong)value._40_8_) {
        value._8_8_ = value._8_8_ + 1;
        value[0x10] = '\0';
        value[0x11] = '\0';
        value[0x12] = '\0';
        value[0x13] = '\0';
        value[0x14] = '\0';
        value[0x15] = '\0';
        value[0x16] = '\0';
        value[0x17] = '\0';
        iVar2 = rand();
        value._0_8_ = ((ulong)(long)iVar2 >> 0xf & 0xffffffffffffff80) + 0x80;
        pcVar7 = (char *)malloc(value._0_8_);
        if (pcVar7 == (char *)0x0) {
          pcVar13 = "test_put_in_evict";
          uVar10 = 0x368;
          goto LAB_00102da5;
        }
        iVar2 = vmemcache_put(uVar10,value + 8,8,pcVar7);
        if (iVar2 != 0) {
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                  ,0x36f,"test_put_in_evict");
          pcVar13 = (char *)value._8_8_;
          pFVar12 = _stderr;
          uVar10 = vmemcache_errormsg();
          pcVar7 = "vmemcache_put(n_puts: %llu): %s";
LAB_00102e04:
          fprintf(pFVar12,pcVar7,pcVar13,uVar10);
          goto LAB_00102d51;
        }
        free(pcVar7);
      }
      vmemcache_delete(uVar10);
      test_offsets(pcVar13,VMEMCACHE_REPLACEMENT_LRU);
      test_offsets(pcVar13,VMEMCACHE_REPLACEMENT_NONE);
      test_vmemcache_get_stat(pcVar13);
      srand((uint)vsize);
      key[0xf8] = '\0';
      key[0xf9] = '\0';
      key[0xfa] = '\0';
      key[0xfb] = '\0';
      key[0xfc] = '\0';
      key[0xfd] = '\0';
      key[0xfe] = '\0';
      key[0xff] = '\0';
      pcVar7 = (char *)malloc(0x100000);
      if (pcVar7 == (char *)0x0) {
        pcVar13 = "test_data_integrity";
        uVar10 = 0x412;
LAB_00102da5:
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,uVar10,pcVar13);
        pcVar13 = "out of memory";
LAB_00102db6:
        pcStackY_1690 = (char *)0xd;
      }
      else {
        for (lVar11 = 0; lVar11 != 0x100000; lVar11 = lVar11 + 1) {
          iVar2 = rand();
          pcVar7[lVar11] = (char)iVar2;
        }
        __ptr = (ulong *)malloc(0x10000);
        if (__ptr == (ulong *)0x0) {
          pcVar13 = "test_data_integrity";
          uVar10 = 0x419;
          goto LAB_00102da5;
        }
        __ptr_00 = malloc(0x10000);
        if (__ptr_00 == (void *)0x0) {
          pcVar13 = "test_data_integrity";
          uVar10 = 0x41e;
          goto LAB_00102da5;
        }
        value[8] = '\0';
        value[9] = '\0';
        value[10] = '\x01';
        value[0xb] = '\0';
        value[0xc] = '\0';
        value[0xd] = '\0';
        value[0xe] = '\0';
        value[0xf] = '\0';
        value[0x10] = '\0';
        value[0x11] = '\0';
        value[0x12] = '\0';
        value[0x13] = '\0';
        value[0x14] = '\0';
        value[0x15] = '\0';
        value[0x16] = '\0';
        value[0x17] = '\0';
        value._0_8_ = __ptr_00;
        vsize = (size_t)pcVar7;
        pVVar6 = (VMEMcache *)vmemcache_new();
        vmemcache_set_size(pVVar6,0x100000);
        vmemcache_set_extent_size(pVVar6,0x100);
        iVar2 = vmemcache_add(pVVar6,pcVar13);
        if (iVar2 != 0) {
          pcVar13 = "test_data_integrity";
          uVar10 = 0x426;
          goto LAB_001035c2;
        }
        vmemcache_callback_on_evict(pVVar6,on_evict_test_data_integrity,&stack0xffffffffffffe988);
        lVar11 = 0;
        while ((ulong)value._16_8_ < 1000) {
          iVar2 = rand();
          iVar3 = rand();
          uVar5 = (ulong)(long)iVar3 % (0xfff01 - (ulong)(long)iVar2 % 0xff01);
          *__ptr = uVar5;
          __n = (ulong)(long)iVar2 % 0xff01 + 0xf0;
          __ptr[1] = __n;
          memcpy(__ptr + 2,(void *)(uVar5 + vsize),__n);
          iVar2 = vmemcache_put(pVVar6,key + 0xf8,8,__ptr);
          if (iVar2 != 0) {
            fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                    "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                    ,0x43a,"test_data_integrity");
            uVar1 = key._248_8_;
            uVar10 = value._16_8_;
            pFVar12 = _stderr;
            uVar9 = vmemcache_errormsg();
            fprintf(pFVar12,"vmemcache_put(n_puts: %llu n_evicts: %llu): %s",uVar1,uVar10,uVar9);
            goto LAB_00102d51;
          }
          lVar11 = key._248_8_ + 1;
          key._248_8_ = lVar11;
        }
        verify_stat_entries(pVVar6,lVar11 - value._16_8_);
        do {
          iVar2 = vmemcache_evict(pVVar6,0,0);
        } while (iVar2 == 0);
        verify_stats(pVVar6,key._248_8_,value._16_8_ * 2,value._16_8_ * 2,0,value._16_8_,entries,
                     in_stack_ffffffffffffe980,(stat_t)pcVar7);
        vmemcache_delete(pVVar6);
        free((void *)vsize);
        free(__ptr);
        free(__ptr_00);
        if (value._16_8_ == key._248_8_) {
          return 0;
        }
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x457,"test_data_integrity");
        pcVar13 = "memory leak detected";
        pcStackY_1690 = (char *)0x14;
      }
LAB_00102db8:
      fwrite(pcVar13,(size_t)pcStackY_1690,1,_stderr);
      goto LAB_00102d51;
    }
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x26e,"test_evict");
    pcVar13 = anon_var_dwarf_514;
    pcStackY_1690 = (char *)0xa;
  }
  else {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x26d,"test_evict");
    pcVar13 = anon_var_dwarf_4fd;
    pcStackY_1690 = (char *)0x2;
    local_60 = local_68;
  }
LAB_001034ee:
  fprintf(_stderr,pcVar13,local_60,pcStackY_1690);
  goto LAB_00102d51;
}

Assistant:

int
main(int argc, char *argv[])
{
	if (argc < 2) {
		fprintf(stderr, "usage: %s dir-name\n", argv[0]);
		exit(-1);
	}
	const char *dir = argv[1];

	unsigned seed;
	if (argc == 3) {
		if (str_to_unsigned(argv[2], &seed) || seed < 1)
			UT_FATAL("incorrect value of seed: %s", argv[2]);
	} else {
		seed = (unsigned)time(NULL);
		printf("seed: %u\n", seed);
	}

	test_new_delete(dir, argv[0], VMEMCACHE_REPLACEMENT_NONE);
	test_new_delete(dir, argv[0], VMEMCACHE_REPLACEMENT_LRU);

	test_put_get_evict(dir, VMEMCACHE_REPLACEMENT_NONE);
	test_put_get_evict(dir, VMEMCACHE_REPLACEMENT_LRU);

	test_get_with_offset(dir);

	test_evict(dir, VMEMCACHE_REPLACEMENT_LRU);

	/* '0' means: key size < 1kB */
	test_memory_leaks(dir, 0, VMEMCACHE_REPLACEMENT_LRU, seed);

	/* '1' means: key size > 1kB */
	test_memory_leaks(dir, 1, VMEMCACHE_REPLACEMENT_LRU, seed);

	test_merge_allocations(dir, VMEMCACHE_REPLACEMENT_NONE);
	test_merge_allocations(dir, VMEMCACHE_REPLACEMENT_LRU);

	test_put_in_evict(dir, VMEMCACHE_REPLACEMENT_LRU, seed);

	test_offsets(dir, VMEMCACHE_REPLACEMENT_LRU);
	test_offsets(dir, VMEMCACHE_REPLACEMENT_NONE);

	test_vmemcache_get_stat(dir);

	test_data_integrity(dir, seed);

	return 0;
}